

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

void P_SpawnFriction(void)

{
  double dVar1;
  int local_34;
  undefined1 local_30 [28];
  int length;
  line_t *l;
  int i;
  
  stack0xffffffffffffffe8 = lines;
  for (l._4_4_ = 0; l._4_4_ < numlines; l._4_4_ = l._4_4_ + 1) {
    if (stack0xffffffffffffffe8->special == 0xdb) {
      if (stack0xffffffffffffffe8->args[1] == 0) {
        line_t::Delta((line_t *)local_30);
        dVar1 = TVector2<double>::Length((TVector2<double> *)local_30);
        local_30._20_4_ = (undefined4)dVar1;
      }
      else {
        if (stack0xffffffffffffffe8->args[1] < 0xc9) {
          local_34 = stack0xffffffffffffffe8->args[1];
        }
        else {
          local_34 = 200;
        }
        local_30._20_4_ = local_34;
      }
      P_SetSectorFriction(stack0xffffffffffffffe8->args[0],local_30._20_4_,false);
      stack0xffffffffffffffe8->special = 0;
    }
    register0x00000000 = stack0xffffffffffffffe8 + 1;
  }
  return;
}

Assistant:

static void P_SpawnFriction(void)
{
	int i;
	line_t *l = lines;

	for (i = 0 ; i < numlines ; i++,l++)
	{
		if (l->special == Sector_SetFriction)
		{
			int length;

			if (l->args[1])
			{	// [RH] Allow setting friction amount from parameter
				length = l->args[1] <= 200 ? l->args[1] : 200;
			}
			else
			{
				length = int(l->Delta().Length());
			}

			P_SetSectorFriction (l->args[0], length, false);
			l->special = 0;
		}
	}
}